

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.h
# Opt level: O3

function<void_()> * __thiscall
Console::bindCallback<int,std::__cxx11::string>
          (function<void_()> *__return_storage_ptr__,Console *this,
          function<void_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
          *callback,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments,int argumentIndex)

{
  int iVar1;
  char *__nptr;
  int *piVar2;
  long lVar3;
  undefined8 uVar4;
  int iVar5;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  nextCallback;
  undefined1 local_98 [32];
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  local_78;
  _Any_data local_58;
  code *local_48;
  int local_38;
  
  iVar5 = (int)arguments;
  lVar3 = *(long *)&(callback->super__Function_base)._M_functor;
  if ((ulong)(long)iVar5 <
      (ulong)(*(long *)((long)&(callback->super__Function_base)._M_functor + 8) - lVar3 >> 5)) {
    __nptr = *(char **)(lVar3 + (long)iVar5 * 0x20);
    piVar2 = __errno_location();
    iVar1 = *piVar2;
    *piVar2 = 0;
    lVar3 = strtol(__nptr,(char **)&local_58,10);
    if ((char *)local_58._M_unused._0_8_ != __nptr) {
      if (((int)lVar3 == lVar3) && (*piVar2 != 0x22)) {
        if (*piVar2 == 0) {
          *piVar2 = iVar1;
        }
        std::
        function<void_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
        ::function((function<void_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                    *)&local_58,
                   (function<void_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                    *)this);
        local_38 = (int)lVar3;
        std::function<void(std::__cxx11::string)>::
        function<Console::bindCallback<int,std::__cxx11::string>(std::function<void(int,std::__cxx11::string)>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,int)::_lambda(std::__cxx11::string)_1_,void>
                  ((function<void(std::__cxx11::string)> *)(local_98 + 0x20),
                   (anon_class_40_2_4fe94ccd *)&local_58);
        if (local_48 != (code *)0x0) {
          (*local_48)(&local_58,&local_58,__destroy_functor);
        }
        std::
        function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
        ::function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                    *)local_98,
                   (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                    *)(local_98 + 0x20));
        bindCallback<std::__cxx11::string>
                  (__return_storage_ptr__,(Console *)local_98,
                   (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                    *)callback,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(ulong)(iVar5 + 1),argumentIndex);
        if ((_Hash_node_base *)local_98._16_8_ != (_Hash_node_base *)0x0) {
          (*(code *)local_98._16_8_)(local_98,local_98,3);
        }
        if ((__node_base_ptr)local_78.super__Function_base._M_manager != (__node_base_ptr)0x0) {
          (*local_78.super__Function_base._M_manager)(local_98 + 0x20,local_98 + 0x20,3);
        }
        return __return_storage_ptr__;
      }
      goto LAB_001124cf;
    }
  }
  else {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  }
  std::__throw_invalid_argument("stoi");
LAB_001124cf:
  uVar4 = std::__throw_out_of_range("stoi");
  __clang_call_terminate(uVar4);
}

Assistant:

std::function<void()> Console::bindCallback(std::function<void(T, Args...)> callback, const std::vector<std::string> &arguments, int argumentIndex)
{
    T value = argumentConverter<T>::convert(arguments.at(argumentIndex));
    std::function<void(Args...)> nextCallback = [callback, value](Args... args) {
        callback(value, args...);
    };
    return bindCallback(nextCallback, arguments, argumentIndex + 1);
}